

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

void Gia_ResbInit(Gia_ResbMan_t *p,Vec_Ptr_t *vDivs,int nWords,int nLimit,int nDivsMax,int iChoice,
                 int fUseXor,int fDebug,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  word *pwVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  if (p->nWords != nWords) {
    __assert_fail("p->nWords == nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x154,
                  "void Gia_ResbInit(Gia_ResbMan_t *, Vec_Ptr_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  p->nLimit = nLimit;
  p->nDivsMax = nDivsMax;
  p->iChoice = iChoice;
  p->fUseXor = fUseXor;
  p->fDebug = fDebug;
  p->fVerbose = fVerbose;
  p->fVeryVerbose = fVeryVerbose;
  iVar6 = vDivs->nSize;
  if (0 < iVar6) {
    ppvVar5 = vDivs->pArray;
    if (0 < nWords) {
      pwVar2 = p->pSets[0];
      pvVar3 = *ppvVar5;
      uVar7 = 0;
      do {
        pwVar2[uVar7] = *(word *)((long)pvVar3 + uVar7 * 8);
        uVar7 = uVar7 + 1;
      } while ((uint)nWords != uVar7);
    }
    if (iVar6 != 1) {
      if (0 < nWords) {
        pwVar2 = p->pSets[1];
        pvVar3 = ppvVar5[1];
        uVar7 = 0;
        do {
          pwVar2[uVar7] = *(word *)((long)pvVar3 + uVar7 * 8);
          uVar7 = uVar7 + 1;
        } while ((uint)nWords != uVar7);
      }
      pVVar4 = p->vDivs;
      pVVar4->nSize = 0;
      if (0 < vDivs->nSize) {
        lVar8 = 0;
        do {
          pvVar3 = vDivs->pArray[lVar8];
          uVar1 = pVVar4->nCap;
          if (pVVar4->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar4->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
              }
              iVar6 = 0x10;
            }
            else {
              iVar6 = uVar1 * 2;
              if (iVar6 <= (int)uVar1) goto LAB_00790a13;
              if (pVVar4->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
              }
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = iVar6;
          }
LAB_00790a13:
          iVar6 = pVVar4->nSize;
          pVVar4->nSize = iVar6 + 1;
          pVVar4->pArray[iVar6] = pvVar3;
          lVar8 = lVar8 + 1;
        } while (lVar8 < vDivs->nSize);
      }
      p->vGates->nSize = 0;
      p->vUnateLits[0]->nSize = 0;
      p->vUnateLits[1]->nSize = 0;
      p->vNotUnateVars[0]->nSize = 0;
      p->vNotUnateVars[1]->nSize = 0;
      p->vUnatePairs[0]->nSize = 0;
      p->vUnatePairs[1]->nSize = 0;
      p->vUnateLitsW[0]->nSize = 0;
      p->vUnateLitsW[1]->nSize = 0;
      p->vUnatePairsW[0]->nSize = 0;
      p->vUnatePairsW[1]->nSize = 0;
      p->vBinateVars->nSize = 0;
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Gia_ResbInit( Gia_ResbMan_t * p, Vec_Ptr_t * vDivs, int nWords, int nLimit, int nDivsMax, int iChoice, int fUseXor, int fDebug, int fVerbose, int fVeryVerbose )
{
    assert( p->nWords == nWords );
    p->nLimit       = nLimit;
    p->nDivsMax     = nDivsMax;
    p->iChoice      = iChoice;
    p->fUseXor      = fUseXor;
    p->fDebug       = fDebug;
    p->fVerbose     = fVerbose;
    p->fVeryVerbose = fVeryVerbose;
    Abc_TtCopy( p->pSets[0], (word *)Vec_PtrEntry(vDivs, 0), nWords, 0 );
    Abc_TtCopy( p->pSets[1], (word *)Vec_PtrEntry(vDivs, 1), nWords, 0 );
    Vec_PtrClear( p->vDivs );
    Vec_PtrAppend( p->vDivs, vDivs );
    Vec_IntClear( p->vGates );
    Vec_IntClear( p->vUnateLits[0]    );
    Vec_IntClear( p->vUnateLits[1]    );
    Vec_IntClear( p->vNotUnateVars[0] );
    Vec_IntClear( p->vNotUnateVars[1] );
    Vec_IntClear( p->vUnatePairs[0]   );
    Vec_IntClear( p->vUnatePairs[1]   );
    Vec_IntClear( p->vUnateLitsW[0]   );
    Vec_IntClear( p->vUnateLitsW[1]   );
    Vec_IntClear( p->vUnatePairsW[0]  );
    Vec_IntClear( p->vUnatePairsW[1]  );
    Vec_IntClear( p->vBinateVars      );
}